

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>_>::string_matcher
          (string_matcher<callbacks_proxy<mock_json_callbacks>_> *this,
          not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          str,bool object_key)

{
  bool object_key_local;
  string_matcher<callbacks_proxy<mock_json_callbacks>_> *this_local;
  not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  str_local;
  
  this_local = (string_matcher<callbacks_proxy<mock_json_callbacks>_> *)str.ptr_;
  matcher<callbacks_proxy<mock_json_callbacks>_>::matcher
            (&this->super_matcher<callbacks_proxy<mock_json_callbacks>_>,2);
  (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>)._vptr_matcher =
       (_func_int **)&PTR__string_matcher_00258198;
  (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).field_0xc = object_key;
  utf::utf8_decoder::utf8_decoder(&this->decoder_);
  appender::appender(&this->app_,
                     (not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      )this_local);
  this->hex_ = 0;
  gsl::not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  operator->((not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              *)&this_local);
  std::__cxx11::string::clear();
  return;
}

Assistant:

explicit string_matcher (gsl::not_null<std::string *> const str,
                                         bool object_key) noexcept
                        : matcher<Callbacks> (start_state)
                        , object_key_{object_key}
                        , app_{str} {
                    str->clear ();
                }